

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if ((this->m_info).capturedExpression._M_string_length == 0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&bStack_58,(string *)&this->m_resultData);
    getExpression_abi_cxx11_(&local_38,this);
    bVar1 = std::operator!=(&bStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  return bVar1;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) >= opCast( rhs );
        }